

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  ImVector<int> *this;
  uint uVar1;
  ImGuiContext *pIVar2;
  uint *puVar3;
  uint local_2c;
  
  pIVar2 = GImGui;
  uVar1 = GImGui->CurrentItemFlags;
  this = &GImGui->ItemFlagsStack;
  puVar3 = (uint *)ImVector<int>::back(this);
  if (uVar1 == *puVar3) {
    local_2c = uVar1 | option;
    if (!enabled) {
      local_2c = ~option & uVar1;
    }
    pIVar2->CurrentItemFlags = local_2c;
    ImVector<int>::push_back(this,(int *)&local_2c);
    return;
  }
  __assert_fail("item_flags == g.ItemFlagsStack.back()",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x1bfb,"void ImGui::PushItemFlag(ImGuiItemFlags, bool)");
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiItemFlags item_flags = g.CurrentItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    g.CurrentItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}